

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

Operand * translateRegister(Operand *__return_storage_ptr__,Operand *reg)

{
  Operand *reg_local;
  
  switch(reg->reg_num) {
  case 0x10:
    Operand::Operand(__return_storage_ptr__,&registers.a);
    break;
  case 0x11:
    Operand::Operand(__return_storage_ptr__,&registers.b);
    break;
  default:
    Operand::Operand(__return_storage_ptr__,reg);
    break;
  case 0x14:
    Operand::Operand(__return_storage_ptr__,&registers.bc);
    break;
  case 0x15:
    Operand::Operand(__return_storage_ptr__,&registers.de);
    break;
  case 0x16:
    Operand::Operand(__return_storage_ptr__,&registers.sp);
    break;
  case 0x17:
    Operand::Operand(__return_storage_ptr__,&registers.iy);
  }
  return __return_storage_ptr__;
}

Assistant:

static Operand translateRegister(const Operand reg) {
	switch (reg.reg_num) {
		case 0x10:
			return registers.a;
		case 0x11:
			return registers.b;
		case 0x14:
			return registers.bc;
		case 0x15:
			return registers.de;
		case 0x16:
			return registers.sp;
		case 0x17:
			return registers.iy;
	}
	return reg;
}